

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall
coins_tests::coins_cache_simulation_test::test_method(coins_cache_simulation_test *this)

{
  DBParams db_params;
  long in_FS_OFFSET;
  CoinsViewOptions options;
  CCoinsViewDB db_base;
  CCoinsViewTest base;
  undefined8 in_stack_fffffffffffffee8;
  char *pcVar1;
  path in_stack_fffffffffffffef8;
  CCoinsViewDB local_d0;
  CCoinsView local_78;
  FastRandomContext *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = &(this->super_CacheTest).super_BasicTestingSetup.m_rng;
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_78._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013ad0a0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  CacheTest::SimulationTest(&this->super_CacheTest,&local_78,false);
  pcVar1 = "test";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&stack0xfffffffffffffef8,(char **)&stack0xfffffffffffffef0,auto_format);
  db_params.path.super_path._M_pathname._M_string_length = (size_type)pcVar1;
  db_params.path.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffee8;
  db_params._16_40_ = in_stack_fffffffffffffef8;
  options._8_8_ = 0x1000000;
  options.batch_write_bytes = (size_t)&stack0xfffffffffffffef8;
  CCoinsViewDB::CCoinsViewDB(&local_d0,db_params,options);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffef8);
  CacheTest::SimulationTest(&this->super_CacheTest,&local_d0.super_CCoinsView,true);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr(&local_d0.m_db);
  std::filesystem::__cxx11::path::~path((path *)&local_d0.m_db_params);
  local_78._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_013ad0a0;
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  ::~_Rb_tree(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(coins_cache_simulation_test, CacheTest)
{
    CCoinsViewTest base{m_rng};
    SimulationTest(&base, false);

    CCoinsViewDB db_base{{.path = "test", .cache_bytes = 1 << 23, .memory_only = true}, {}};
    SimulationTest(&db_base, true);
}